

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_aggregate_expression.cpp
# Opt level: O3

Value * duckdb::NegatePercentileValue(Value *__return_storage_ptr__,Value *v,bool desc)

{
  PhysicalType PVar1;
  uint8_t width;
  uint8_t scale;
  bool bVar2;
  Value *pVVar3;
  Value *extraout_RAX;
  BinderException *this;
  InternalException *this_00;
  InvalidInputException *pIVar4;
  int64_t iVar5;
  double dVar6;
  hugeint_t hVar7;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  int result;
  hugeint_t integral;
  undefined8 local_60;
  string local_58;
  hugeint_t local_38;
  
  if (v->is_null != true) {
    dVar6 = Value::GetValue<double>(v);
    if ((dVar6 < 0.0) || (1.0 < dVar6)) {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"PERCENTILEs can only take parameters in the range [0, 1]","");
      BinderException::BinderException(this,&local_58);
      __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (desc) {
      if ((v->type_).id_ != DECIMAL) {
        dVar6 = Value::GetValue<double>(v);
        pVVar3 = Value::DOUBLE(__return_storage_ptr__,-dVar6);
        return pVVar3;
      }
      local_38 = IntegralValue::Get(v);
      width = DecimalType::GetWidth(&v->type_);
      scale = DecimalType::GetScale(&v->type_);
      PVar1 = (v->type_).physical_type_;
      if (PVar1 < INT64) {
        if (PVar1 == INT16) {
          hVar7 = hugeint_t::operator-(&local_38);
          input_00.lower = hVar7.upper;
          iVar5 = 0;
          bVar2 = TryCast::Operation<duckdb::hugeint_t,short>(hVar7,(int16_t *)&local_60,false);
          if (!bVar2) {
            pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            input_00.upper = iVar5;
            CastExceptionText<duckdb::hugeint_t,short>(&local_58,(duckdb *)hVar7.lower,input_00);
            InvalidInputException::InvalidInputException(pIVar4,&local_58);
            __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          pVVar3 = Value::DECIMAL(__return_storage_ptr__,(int16_t)local_60,width,scale);
        }
        else {
          if (PVar1 != INT32) {
LAB_011ae3e8:
            this_00 = (InternalException *)__cxa_allocate_exception(0x10);
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,"Unknown DECIMAL type","");
            InternalException::InternalException(this_00,&local_58);
            __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          hVar7 = hugeint_t::operator-(&local_38);
          input.lower = hVar7.upper;
          iVar5 = 0;
          bVar2 = TryCast::Operation<duckdb::hugeint_t,int>(hVar7,(int32_t *)&local_60,false);
          if (!bVar2) {
            pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            input.upper = iVar5;
            CastExceptionText<duckdb::hugeint_t,int>(&local_58,(duckdb *)hVar7.lower,input);
            InvalidInputException::InvalidInputException(pIVar4,&local_58);
            __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          pVVar3 = Value::DECIMAL(__return_storage_ptr__,CONCAT22(local_60._2_2_,(int16_t)local_60),
                                  width,scale);
        }
      }
      else if (PVar1 == INT64) {
        hVar7 = hugeint_t::operator-(&local_38);
        input_01.lower = hVar7.upper;
        iVar5 = 0;
        bVar2 = TryCast::Operation<duckdb::hugeint_t,long>(hVar7,&local_60,false);
        if (!bVar2) {
          pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          input_01.upper = iVar5;
          CastExceptionText<duckdb::hugeint_t,long>(&local_58,(duckdb *)hVar7.lower,input_01);
          InvalidInputException::InvalidInputException(pIVar4,&local_58);
          __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pVVar3 = Value::DECIMAL(__return_storage_ptr__,
                                CONCAT44(local_60._4_4_,CONCAT22(local_60._2_2_,(int16_t)local_60)),
                                width,scale);
      }
      else {
        if (PVar1 != INT128) goto LAB_011ae3e8;
        hVar7 = hugeint_t::operator-(&local_38);
        pVVar3 = Value::DECIMAL(__return_storage_ptr__,hVar7,width,scale);
      }
      return pVVar3;
    }
  }
  Value::Value(__return_storage_ptr__,v);
  return extraout_RAX;
}

Assistant:

static Value NegatePercentileValue(const Value &v, const bool desc) {
	if (v.IsNull()) {
		return v;
	}

	const auto frac = v.GetValue<double>();
	if (frac < 0 || frac > 1) {
		throw BinderException("PERCENTILEs can only take parameters in the range [0, 1]");
	}

	if (!desc) {
		return v;
	}

	const auto &type = v.type();
	switch (type.id()) {
	case LogicalTypeId::DECIMAL: {
		// Negate DECIMALs as DECIMAL.
		const auto integral = IntegralValue::Get(v);
		const auto width = DecimalType::GetWidth(type);
		const auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return Value::DECIMAL(Cast::Operation<hugeint_t, int16_t>(-integral), width, scale);
		case PhysicalType::INT32:
			return Value::DECIMAL(Cast::Operation<hugeint_t, int32_t>(-integral), width, scale);
		case PhysicalType::INT64:
			return Value::DECIMAL(Cast::Operation<hugeint_t, int64_t>(-integral), width, scale);
		case PhysicalType::INT128:
			return Value::DECIMAL(-integral, width, scale);
		default:
			throw InternalException("Unknown DECIMAL type");
		}
	}
	default:
		// Everything else can just be a DOUBLE
		return Value::DOUBLE(-v.GetValue<double>());
	}
}